

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O2

EC_GROUP * anon_unknown.dwarf_4495f9::GetCurve(FileTest *t,char *key)

{
  bool bVar1;
  EC_GROUP *pEVar2;
  string curve_name;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Curve",&local_59);
  bVar1 = FileTest::GetAttribute(t,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    bVar1 = std::operator==(&local_58,"P-224");
    if (bVar1) {
      pEVar2 = EC_group_p224();
    }
    else {
      bVar1 = std::operator==(&local_58,"P-256");
      if (bVar1) {
        pEVar2 = EC_group_p256();
      }
      else {
        bVar1 = std::operator==(&local_58,"P-384");
        if (bVar1) {
          pEVar2 = EC_group_p384();
        }
        else {
          bVar1 = std::operator==(&local_58,"P-521");
          if (bVar1) {
            pEVar2 = EC_group_p521();
          }
          else {
            pEVar2 = (EC_GROUP *)0x0;
            FileTest::PrintLine(t,"Unknown curve \'%s\'",local_58._M_dataplus._M_p);
          }
        }
      }
    }
  }
  else {
    pEVar2 = (EC_GROUP *)0x0;
  }
  std::__cxx11::string::~string((string *)&local_58);
  return pEVar2;
}

Assistant:

static const EC_GROUP *GetCurve(FileTest *t, const char *key) {
  std::string curve_name;
  if (!t->GetAttribute(&curve_name, key)) {
    return nullptr;
  }

  if (curve_name == "P-224") {
    return EC_group_p224();
  }
  if (curve_name == "P-256") {
    return EC_group_p256();
  }
  if (curve_name == "P-384") {
    return EC_group_p384();
  }
  if (curve_name == "P-521") {
    return EC_group_p521();
  }

  t->PrintLine("Unknown curve '%s'", curve_name.c_str());
  return nullptr;
}